

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzReadNumber32(CSzData *sd,UInt32 *value)

{
  uint *in_RSI;
  CSzData *in_RDI;
  int __result__;
  UInt64 value64;
  Byte firstByte;
  ulong local_28;
  byte local_19;
  uint *local_18;
  SRes local_4;
  
  if (in_RDI->Size == 0) {
    local_4 = 0x10;
  }
  else {
    local_19 = *in_RDI->Data;
    if ((local_19 & 0x80) == 0) {
      *in_RSI = (uint)local_19;
      in_RDI->Data = in_RDI->Data + 1;
      in_RDI->Size = in_RDI->Size - 1;
      local_4 = 0;
    }
    else {
      local_18 = in_RSI;
      local_4 = ReadNumber(in_RDI,&local_28);
      if (local_4 == 0) {
        if (local_28 < 0x7fffffff) {
          if (local_28 < 0x1000000000000000) {
            *local_18 = (uint)local_28;
            local_4 = 0;
          }
          else {
            local_4 = 4;
          }
        }
        else {
          local_4 = 4;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static MY_NO_INLINE SRes SzReadNumber32(CSzData *sd, UInt32 *value)
{
  Byte firstByte;
  UInt64 value64;
  if (sd->Size == 0)
    return SZ_ERROR_ARCHIVE;
  firstByte = *sd->Data;
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    sd->Data++;
    sd->Size--;
    return SZ_OK;
  }
  RINOK(ReadNumber(sd, &value64));
  if (value64 >= (UInt32)0x80000000 - 1)
    return SZ_ERROR_UNSUPPORTED;
  if (value64 >= ((UInt64)(1) << ((sizeof(size_t) - 1) * 8 + 4)))
    return SZ_ERROR_UNSUPPORTED;
  *value = (UInt32)value64;
  return SZ_OK;
}